

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bucket_skew.cpp
# Opt level: O0

void compute_skew<4u>(vector<unsigned_int,_std::allocator<unsigned_int>_> *input,string *name)

{
  value_type vVar1;
  value_type vVar2;
  ulong uVar3;
  uint32_t uVar4;
  size_type sVar5;
  reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  ostream *poVar9;
  string *in_RSI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar13 [64];
  undefined1 extraout_var [56];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double bits;
  size_t j;
  double bits_real;
  double bits_uniform;
  size_t i_4;
  size_t usage_cum_sum;
  value_type bucket_offset;
  uint32_t bucket_id_1;
  size_t i_3;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  real_dists;
  uint32_t bucket_id;
  size_t i_2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> bucket_usage;
  value_type cur;
  size_t i_1;
  int cur_size;
  uint32_t prev;
  vector<unsigned_int,_std::allocator<unsigned_int>_> bucket_max;
  vector<unsigned_int,_std::allocator<unsigned_int>_> bucket_min;
  vector<unsigned_int,_std::allocator<unsigned_int>_> bucket_sizes;
  size_t i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> bucket_map;
  value_type *in_stack_fffffffffffffd78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffd80;
  ostream *in_stack_fffffffffffffd90;
  size_type in_stack_fffffffffffffd98;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffda0;
  ulong local_148;
  double local_140;
  ulong local_130;
  ulong local_128;
  ulong local_118;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_108;
  uint32_t local_ec;
  ulong local_e8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_d8;
  int local_c0;
  int local_bc;
  int local_b8;
  undefined4 local_b4;
  int local_b0;
  value_type local_ac;
  ulong local_a8;
  int local_9c;
  undefined4 local_98;
  value_type local_94;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_90;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  ulong local_48;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_28;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_8;
  
  local_8 = in_RDI;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x189714);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffda0,
             in_stack_fffffffffffffd98,(allocator_type *)in_stack_fffffffffffffd90);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x18973d);
  for (local_48 = 0; uVar3 = local_48,
      sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_28),
      uVar3 < sVar5; local_48 = local_48 + 1) {
    uVar4 = compute_bucket<4u>((uint32_t)local_48);
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&local_28,local_48);
    *pvVar6 = uVar4;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x18980f);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x189824);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x189831);
  pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_28,0);
  local_94 = *pvVar6;
  local_98 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  local_9c = 1;
  for (local_a8 = 1; uVar3 = local_a8,
      sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_28),
      uVar3 < sVar5; local_a8 = local_a8 + 1) {
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&local_28,local_a8);
    local_ac = *pvVar6;
    if (local_ac != local_94) {
      local_b0 = (int)local_a8 + -1;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      local_b4 = (int)local_a8;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      local_b8 = local_9c;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      local_9c = 0;
    }
    local_9c = local_9c + 1;
    local_94 = local_ac;
  }
  if (local_9c != 0) {
    sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_28);
    local_bc = (int)sVar5 + -1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    local_c0 = local_9c;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_60);
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x189a3e);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffda0,
             in_stack_fffffffffffffd98,(allocator_type *)in_stack_fffffffffffffd90);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x189a6a);
  for (local_e8 = 0; uVar3 = local_e8,
      sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_8), uVar3 < sVar5
      ; local_e8 = local_e8 + 1) {
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](local_8,local_e8);
    local_ec = compute_bucket<4u>(*pvVar6);
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&local_d8,(ulong)local_ec);
    *pvVar6 = *pvVar6 + 1;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_60);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x189b79);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
           (allocator_type *)in_stack_fffffffffffffd90);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x189ba5);
  for (local_118 = 0;
      sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_8),
      local_118 < sVar5; local_118 = local_118 + 1) {
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](local_8,local_118)
    ;
    uVar4 = compute_bucket<4u>(*pvVar6);
    pvVar7 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](&local_108,(ulong)uVar4);
    sVar5 = std::vector<double,_std::allocator<double>_>::size(pvVar7);
    if (sVar5 == 0) {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator[](&local_108,(ulong)uVar4);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_60,(ulong)uVar4);
      std::vector<double,_std::allocator<double>_>::resize
                (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    }
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](local_8,local_118)
    ;
    vVar1 = *pvVar6;
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&local_78,(ulong)uVar4);
    vVar2 = *pvVar6;
    pvVar7 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](&local_108,(ulong)uVar4);
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](pvVar7,(ulong)(vVar1 - vVar2))
    ;
    in_ZMM0 = ZEXT864((ulong)(*pvVar8 + 1.0));
    *pvVar8 = *pvVar8 + 1.0;
  }
  local_128 = 0;
  for (local_130 = 0;
      sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_60),
      local_130 < sVar5; local_130 = local_130 + 1) {
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&local_d8,local_130);
    auVar12 = in_ZMM0._0_16_;
    if (*pvVar6 != 0) {
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&local_60,local_130);
      auVar12 = vcvtusi2sd_avx512f(auVar12,*pvVar6);
      dVar10 = log2(1.0 / auVar12._0_8_);
      auVar13 = ZEXT1664((undefined1  [16])0x0);
      local_140 = 0.0;
      local_148 = 0;
      while( true ) {
        auVar12 = auVar13._0_16_;
        pvVar7 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](&local_108,local_130);
        sVar5 = std::vector<double,_std::allocator<double>_>::size(pvVar7);
        if (sVar5 <= local_148) break;
        pvVar7 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](&local_108,local_130);
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](pvVar7,local_148);
        dVar11 = *pvVar8;
        auVar13 = ZEXT864((ulong)dVar11);
        auVar12 = (undefined1  [16])0x0;
        if ((dVar11 != 0.0) || (NAN(dVar11))) {
          pvVar7 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](&local_108,local_130);
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](pvVar7,local_148);
          dVar11 = *pvVar8;
          pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (&local_d8,local_130);
          auVar12 = vcvtusi2sd_avx512f(auVar12,*pvVar6);
          dVar11 = log2(dVar11 / auVar12._0_8_);
          pvVar7 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](&local_108,local_130);
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](pvVar7,local_148);
          auVar14._8_8_ = 0;
          auVar14._0_8_ = *pvVar8;
          auVar12._8_8_ = 0;
          auVar12._0_8_ = -dVar11;
          auVar15._8_8_ = 0;
          auVar15._0_8_ = local_140;
          auVar12 = vfmadd213sd_fma(auVar12,auVar14,auVar15);
          auVar13 = ZEXT1664(auVar12);
          local_140 = auVar12._0_8_;
        }
        local_148 = local_148 + 1;
      }
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&local_d8,local_130);
      auVar12 = vcvtusi2sd_avx512f(auVar12,*pvVar6);
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&local_d8,local_130);
      local_128 = local_128 + *pvVar6;
      poVar9 = std::operator<<((ostream *)&std::cout,in_RSI);
      poVar9 = std::operator<<(poVar9,";");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_130);
      poVar9 = std::operator<<(poVar9,";");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,4);
      poVar9 = std::operator<<(poVar9,";");
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&local_78,local_130);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,*pvVar6);
      poVar9 = std::operator<<(poVar9,";");
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&local_90,local_130);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,*pvVar6);
      poVar9 = std::operator<<(poVar9,";");
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&local_60,local_130);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,*pvVar6);
      poVar9 = std::operator<<(poVar9,";");
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&local_d8,local_130);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,*pvVar6);
      poVar9 = std::operator<<(poVar9,";");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_128);
      in_stack_fffffffffffffd90 = std::operator<<(poVar9,";");
      sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_8);
      poVar9 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffd90,sVar5);
      poVar9 = std::operator<<(poVar9,";");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,-dVar10 - local_140 / auVar12._0_8_);
      in_ZMM0._0_8_ = std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      in_ZMM0._8_56_ = extraout_var;
    }
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)in_stack_fffffffffffffd90);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffd90);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffd90);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffd90);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffd90);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffd90);
  return;
}

Assistant:

void compute_skew(std::vector<uint32_t>& input, std::string name)
{
    std::vector<uint32_t> bucket_map(1 << 27);
    for (size_t i = 0; i < bucket_map.size(); i++) {
        bucket_map[i] = compute_bucket<fidelity>(i);
    }
    std::vector<uint32_t> bucket_sizes;
    std::vector<uint32_t> bucket_min;
    std::vector<uint32_t> bucket_max;
    uint32_t prev = bucket_map[0];
    bucket_min.push_back(0);
    auto cur_size = 1;
    for (size_t i = 1; i < bucket_map.size(); i++) {
        auto cur = bucket_map[i];
        if (cur != prev) {
            bucket_max.push_back(i - 1);
            bucket_min.push_back(i);
            bucket_sizes.push_back(cur_size);
            cur_size = 0;
        }
        cur_size++;
        prev = cur;
    }
    if (cur_size) {
        bucket_max.push_back(bucket_map.size() - 1);
        bucket_sizes.push_back(cur_size);
    }

    std::vector<uint32_t> bucket_usage(bucket_sizes.size());
    for (size_t i = 0; i < input.size(); i++) {
        auto bucket_id = compute_bucket<fidelity>(input[i]);
        bucket_usage[bucket_id]++;
    }

    std::vector<std::vector<double>> real_dists(bucket_sizes.size());
    for (size_t i = 0; i < input.size(); i++) {
        auto bucket_id = compute_bucket<fidelity>(input[i]);
        if (real_dists[bucket_id].size() == 0)
            real_dists[bucket_id].resize(bucket_sizes[bucket_id]);
        auto bucket_offset = input[i] - bucket_min[bucket_id];
        real_dists[bucket_id][bucket_offset] += 1.0;
    }
    size_t usage_cum_sum = 0;
    for (size_t i = 0; i < bucket_sizes.size(); i++) {
        if (bucket_usage[i] != 0) {
            double bits_uniform = -log2(double(1.0) / double(bucket_sizes[i]));
            double bits_real = 0.0;
            for (size_t j = 0; j < real_dists[i].size(); j++) {
                if (real_dists[i][j] != 0.0) {
                    double bits
                        = -log2(real_dists[i][j] / double(bucket_usage[i]));
                    bits_real += real_dists[i][j] * bits;
                }
            }
            bits_real /= double(bucket_usage[i]);
            usage_cum_sum += bucket_usage[i];
            std::cout << name << ";" << i << ";" << fidelity << ";"
                      << bucket_min[i] << ";" << bucket_max[i] << ";"
                      << bucket_sizes[i] << ";" << bucket_usage[i] << ";"
                      << usage_cum_sum << ";" << input.size() << ";"
                      << (bits_uniform - bits_real) << std::endl;
        }
    }
}